

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O0

void av1_reset_entropy_context(MACROBLOCKD *xd,BLOCK_SIZE bsize,int num_planes)

{
  byte bVar1;
  byte bVar2;
  BLOCK_SIZE BVar3;
  long lVar4;
  int in_EDX;
  BLOCK_SIZE in_SIL;
  long in_RDI;
  int txs_high;
  int txs_wide;
  BLOCK_SIZE plane_bsize;
  macroblockd_plane *pd;
  int i;
  int nplanes;
  int local_18;
  
  bVar1 = *(byte *)(in_RDI + 0xc);
  for (local_18 = 0; local_18 < (int)((in_EDX + -1) * (uint)(bVar1 & 1) + 1);
      local_18 = local_18 + 1) {
    lVar4 = in_RDI + 0x10 + (long)local_18 * 0xa30;
    BVar3 = get_plane_block_size(in_SIL,*(int *)(lVar4 + 4),*(int *)(lVar4 + 8));
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar3];
    memset(*(void **)(lVar4 + 0x70),0,
           (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar3]);
    memset(*(void **)(lVar4 + 0x78),0,(long)(int)(uint)bVar2);
  }
  return;
}

Assistant:

void av1_reset_entropy_context(MACROBLOCKD *xd, BLOCK_SIZE bsize,
                               const int num_planes) {
  assert(bsize < BLOCK_SIZES_ALL);
  const int nplanes = 1 + (num_planes - 1) * xd->is_chroma_ref;
  for (int i = 0; i < nplanes; i++) {
    struct macroblockd_plane *const pd = &xd->plane[i];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    const int txs_wide = mi_size_wide[plane_bsize];
    const int txs_high = mi_size_high[plane_bsize];
    memset(pd->above_entropy_context, 0, sizeof(ENTROPY_CONTEXT) * txs_wide);
    memset(pd->left_entropy_context, 0, sizeof(ENTROPY_CONTEXT) * txs_high);
  }
}